

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

void __thiscall asmjit::CodeHolder::setLogger(CodeHolder *this,Logger *logger)

{
  Logger *in_RSI;
  CodeHolder *in_RDI;
  uint32_t opt;
  uint32_t local_14;
  
  local_14 = 0;
  if (in_RSI != (Logger *)0x0) {
    local_14 = 4;
  }
  in_RDI->_logger = in_RSI;
  CodeHolder_setGlobalOption(in_RDI,4,local_14);
  return;
}

Assistant:

void CodeHolder::setLogger(Logger* logger) noexcept {
  uint32_t opt = 0;
  if (logger) opt = CodeEmitter::kOptionLoggingEnabled;

  _logger = logger;
  CodeHolder_setGlobalOption(this, CodeEmitter::kOptionLoggingEnabled, opt);
}